

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::VerifyMark
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  Recycler *this_00;
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  ushort uVar4;
  uint uVar5;
  uint index;
  undefined4 *puVar6;
  SmallHeapBlockBitVector *this_01;
  byte *pbVar7;
  void *target;
  char *pcStack_170;
  uint i;
  char *objectAddress;
  undefined1 local_160 [4];
  uint objectIndex;
  FBVEnumerator _bvenum;
  BVIndex bitIndex;
  Recycler *recycler;
  uint objectWordCount;
  SmallHeapBlockBitVector *invalid;
  SmallHeapBlockBitVector *free;
  SmallHeapBlockBitVector tempFreeBits;
  SmallHeapBlockBitVector *marked;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_local;
  
  if (((this->super_HeapBlock).needOOMRescan & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x3e4,"(!this->needOOMRescan)","!this->needOOMRescan");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  tempFreeBits.data[0x1f].word = (Type)GetMarkedBitVector(this);
  BVStatic<2048UL>::BVStatic((BVStatic<2048UL> *)&free);
  BuildFreeBitVector(this,(SmallHeapBlockBitVector *)&free);
  this_01 = GetInvalidBitVector(this);
  uVar5 = GetObjectWordCount(this);
  this_00 = this->heapBucket->heapInfo->recycler;
  BVStatic<2048UL>::BeginSetBits
            ((FBVEnumerator *)local_160,(BVStatic<2048UL> *)tempFreeBits.data[0x1f].word);
  do {
    bVar2 = JsUtil::FBVEnumerator::End((FBVEnumerator *)local_160);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return;
    }
    _bvenum.curUnit.word._4_4_ = JsUtil::FBVEnumerator::GetCurrent((FBVEnumerator *)local_160);
    BVar3 = BVStatic<2048UL>::Test((BVStatic<2048UL> *)&free,_bvenum.curUnit.word._4_4_);
    if ((BVar3 == '\0') &&
       (BVar3 = BVStatic<2048UL>::Test(this_01,_bvenum.curUnit.word._4_4_), BVar3 == '\0')) {
      bVar2 = IsValidBitIndex(this,_bvenum.curUnit.word._4_4_);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x3f2,"(IsValidBitIndex(bitIndex))","IsValidBitIndex(bitIndex)");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      uVar4 = GetObjectIndexFromBitIndex(this,(ushort)_bvenum.curUnit.word._4_4_);
      index = (uint)uVar4;
      pbVar7 = ObjectInfo(this,index);
      if ((*pbVar7 & 4) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x3f5,"((this->ObjectInfo(objectIndex) & NewTrackBit) == 0)",
                           "(this->ObjectInfo(objectIndex) & NewTrackBit) == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      bVar2 = HeapBlock::IsLeafBlock(&this->super_HeapBlock);
      if ((!bVar2) &&
         (((bVar2 = IsWithBarrier(this), !bVar2 || ((DAT_01eca37e & 1) != 0)) &&
          (pbVar7 = ObjectInfo(this,index), (*pbVar7 & 0x20) == 0)))) {
        pcStack_170 = (this->super_HeapBlock).address + index * this->objectSize;
        for (target._4_4_ = 0; target._4_4_ < uVar5; target._4_4_ = target._4_4_ + 1) {
          bVar2 = Recycler::VerifyMark(this_00,pcStack_170,*(void **)pcStack_170);
          if (((bVar2) && ((DAT_01eca37e & 1) != 0)) && ((DAT_01eca37f & 1) != 0)) {
            (*(this->super_HeapBlock)._vptr_HeapBlock[3])();
          }
          pcStack_170 = pcStack_170 + 8;
        }
      }
    }
    JsUtil::FBVEnumerator::operator++((FBVEnumerator *)local_160,0);
  } while( true );
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::VerifyMark()
{
    Assert(!this->needOOMRescan);

    SmallHeapBlockBitVector * marked = this->GetMarkedBitVector();
    SmallHeapBlockBitVector tempFreeBits;
    this->BuildFreeBitVector(&tempFreeBits);
    SmallHeapBlockBitVector * free = &tempFreeBits;
    SmallHeapBlockBitVector const * invalid = this->GetInvalidBitVector();
    uint objectWordCount = this->GetObjectWordCount();
    Recycler * recycler = this->heapBucket->heapInfo->recycler;

    FOREACH_BITSET_IN_FIXEDBV(bitIndex, marked)
    {
        if (!free->Test(bitIndex) && !invalid->Test(bitIndex))
        {
            Assert(IsValidBitIndex(bitIndex));
            uint objectIndex = GetObjectIndexFromBitIndex((ushort)bitIndex);

            Assert((this->ObjectInfo(objectIndex) & NewTrackBit) == 0);

            // NOTE: We can't verify mark for software write barrier blocks, because they may have
            // non-pointer updates that don't trigger the write barrier, but still look like a false reference.
            // Thus, when we get here, we'll see a false reference that isn't marked.
            // Since this situation is hard to detect, just don't verify mark for write barrier blocks.
            // We could fix this if we had object layout info.

            if (!this->IsLeafBlock()
#ifdef RECYCLER_WRITE_BARRIER
                && (!this->IsWithBarrier() || CONFIG_FLAG(ForceSoftwareWriteBarrier))
#endif
                )
            {
                if ((ObjectInfo(objectIndex) & LeafBit) == 0)
                {
                    char * objectAddress = this->address + objectIndex * objectSize;
                    for (uint i = 0; i < objectWordCount; i++)
                    {
                        void* target = *(void**) objectAddress;
                        if (recycler->VerifyMark(objectAddress, target))
                        {
#if DBG && GLOBAL_ENABLE_WRITE_BARRIER
                            if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
                            {
                                this->WBVerifyBitIsSet(objectAddress);
                            }
#endif
                        }

                        objectAddress += sizeof(void *);
                    }
                }
            }
        }
    }
    NEXT_BITSET_IN_FIXEDBV;
}